

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

RPCHelpMan * getindexinfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_04;
  RPCArgOptions opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  undefined8 uVar6;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff798;
  undefined8 in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7b8;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff7c8;
  pointer in_stack_fffffffffffff7d8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff7e0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff7e8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff7f0;
  pointer in_stack_fffffffffffff7f8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff800;
  pointer pRVar12;
  pointer in_stack_fffffffffffff808;
  pointer pRVar13;
  pointer in_stack_fffffffffffff810;
  pointer in_stack_fffffffffffff818;
  pointer in_stack_fffffffffffff820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff828;
  undefined1 auVar14 [32];
  undefined1 in_stack_fffffffffffff838 [64];
  _Alloc_hider in_stack_fffffffffffff878;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  ulong *local_5c8;
  undefined8 local_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  ulong *local_5a8;
  size_type local_5a0;
  ulong local_598;
  undefined8 uStack_590;
  long *local_588 [2];
  long local_578 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_568;
  long *local_548 [2];
  long local_538 [2];
  pointer local_528 [2];
  undefined1 local_518 [152];
  RPCResult local_480;
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getindexinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns the status of one or all available indices currently running in the node.\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"index_name","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Filter results for an index with a specific name.","");
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  name.field_2._8_8_ = in_stack_fffffffffffff7b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff7c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff7b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff7c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff7d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff7e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff7e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff7f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff800;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff808;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff810;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff820;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  description_04.field_2 = in_stack_fffffffffffff828;
  opts._64_8_ = in_stack_fffffffffffff878._M_p;
  auVar14 = in_stack_fffffffffffff838._8_32_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff838[0];
  opts._1_7_ = in_stack_fffffffffffff838._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)auVar14._0_8_;
  opts.oneline_description._M_string_length = auVar14._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar14._16_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff838._40_24_;
  local_260 = &local_250;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_04,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff860,__l,
             (allocator_type *)&stack0xfffffffffffff85f);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"name","");
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"The name of the index","");
  local_528[0] = (pointer)local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"synced","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_548,"Whether the index is synced or not","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description._M_string_length = in_stack_fffffffffffff7c0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description.field_2 = in_stack_fffffffffffff7c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff7e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff7d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff7e8;
  RPCResult::RPCResult
            ((RPCResult *)(local_518 + 0x10),BOOL,m_key_name,description,inner,SUB81(local_528,0));
  local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"best_block_height","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"The block height to which the index is synced","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_00._M_string_length = in_stack_fffffffffffff7c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff7c8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_480,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_568,0));
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_518 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff810,__l_00,
             (allocator_type *)&stack0xfffffffffffff7d7);
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_01._M_string_length = in_stack_fffffffffffff7c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff7c8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_3b8,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_3d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_3b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff828,__l_01,
             (allocator_type *)&stack0xfffffffffffff7d6);
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_02._M_string_length = in_stack_fffffffffffff7c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_02.field_2 = in_stack_fffffffffffff7c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_2f0,OBJ_DYN,m_key_name_02,description_02,inner_02,SUB81(local_310,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff798;
  result.m_key_name._M_string_length = in_stack_fffffffffffff7a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff7b0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff7b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff7c8;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff7f0;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff810;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff818;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff840,result);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"getindexinfo","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"");
  HelpExampleCli(&local_628,&local_648,&local_668);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"getindexinfo","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  HelpExampleRpc(&local_688,&local_6a8,&local_6c8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    uVar6 = local_628.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_688._M_string_length + local_628._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      uVar6 = local_688.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_688._M_string_length + local_628._M_string_length) goto LAB_003673c0;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_688,0,0,local_628._M_dataplus._M_p,local_628._M_string_length);
  }
  else {
LAB_003673c0:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_628,local_688._M_dataplus._M_p,local_688._M_string_length);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if (paVar2 == paVar1) {
    local_608.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_608.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_608.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
  }
  else {
    local_608.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_608._M_dataplus._M_p = (pointer)paVar2;
  }
  local_608._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"getindexinfo","");
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"txindex","");
  HelpExampleCli(&local_6e8,&local_708,&local_728);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    uVar6 = local_608.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_6e8._M_string_length + local_608._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      uVar6 = local_6e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_6e8._M_string_length + local_608._M_string_length) goto LAB_003674f9;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_6e8,0,0,local_608._M_dataplus._M_p,local_608._M_string_length);
  }
  else {
LAB_003674f9:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_608,local_6e8._M_dataplus._M_p,local_6e8._M_string_length);
  }
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if (paVar2 == paVar1) {
    local_5e8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_5e8.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_5e8.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
  }
  else {
    local_5e8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_5e8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_5e8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"getindexinfo","");
  _Var15._M_p = (pointer)&local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff878,"txindex","");
  HelpExampleRpc(&local_748,&local_768,(string *)&stack0xfffffffffffff878);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    uVar6 = local_5e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_748._M_string_length + local_5e8._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_748._M_dataplus._M_p != &local_748.field_2) {
      uVar6 = local_748.field_2._M_allocated_capacity;
    }
    if (local_748._M_string_length + local_5e8._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_748,0,0,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
      goto LAB_0036765b;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_5e8,local_748._M_dataplus._M_p,local_748._M_string_length);
LAB_0036765b:
  local_5c8 = &local_5b8;
  puVar3 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_5b8 = paVar1->_M_allocated_capacity;
    uStack_5b0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_5b8 = paVar1->_M_allocated_capacity;
    local_5c8 = puVar3;
  }
  local_5a0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_5c8 == &local_5b8) {
    uStack_590 = uStack_5b0;
    local_5a8 = &local_598;
  }
  else {
    local_5a8 = local_5c8;
  }
  local_598 = local_5b8;
  local_5c0 = 0;
  local_5b8 = local_5b8 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/node.cpp:381:17)>
           ::_M_manager;
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/node.cpp:381:17)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/node.cpp:381:17)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffff7c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7f0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = (size_type)in_stack_fffffffffffff810;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff818;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff820;
  local_5c8 = &local_5b8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff7a8)),description_03,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff7a8,&stack0xfffffffffffff7a8,3);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var15._M_p != &local_778) {
    operator_delete(_Var15._M_p,local_778._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_cond._M_dataplus._M_p != &local_3b8.m_cond.field_2) {
    operator_delete(local_3b8.m_cond._M_dataplus._M_p,
                    local_3b8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_description._M_dataplus._M_p != &local_3b8.m_description.field_2) {
    operator_delete(local_3b8.m_description._M_dataplus._M_p,
                    local_3b8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3b8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_key_name._M_dataplus._M_p != &local_3b8.m_key_name.field_2) {
    operator_delete(local_3b8.m_key_name._M_dataplus._M_p,
                    local_3b8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff810);
  lVar5 = 0x110;
  do {
    if ((long *)(local_518 + lVar5) != *(long **)((long)local_528 + lVar5)) {
      operator_delete(*(long **)((long)local_528 + lVar5),*(long *)(local_518 + lVar5) + 1);
    }
    if ((long *)((long)local_538 + lVar5) != *(long **)((long)local_548 + lVar5)) {
      operator_delete(*(long **)((long)local_548 + lVar5),*(long *)((long)local_538 + lVar5) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar5));
    if ((long *)((long)local_578 + lVar5) != *(long **)((long)local_588 + lVar5)) {
      operator_delete(*(long **)((long)local_588 + lVar5),*(long *)((long)local_578 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8);
  if (local_588[0] != local_578) {
    operator_delete(local_588[0],local_578[0] + 1);
  }
  if (local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_568.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7f8);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_528[0] != (pointer)local_518) {
    operator_delete(local_528[0],local_518._0_8_ + 1);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff860);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getindexinfo()
{
    return RPCHelpMan{"getindexinfo",
                "\nReturns the status of one or all available indices currently running in the node.\n",
                {
                    {"index_name", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Filter results for an index with a specific name."},
                },
                RPCResult{
                    RPCResult::Type::OBJ_DYN, "", "", {
                        {
                            RPCResult::Type::OBJ, "name", "The name of the index",
                            {
                                {RPCResult::Type::BOOL, "synced", "Whether the index is synced or not"},
                                {RPCResult::Type::NUM, "best_block_height", "The block height to which the index is synced"},
                            }
                        },
                    },
                },
                RPCExamples{
                    HelpExampleCli("getindexinfo", "")
                  + HelpExampleRpc("getindexinfo", "")
                  + HelpExampleCli("getindexinfo", "txindex")
                  + HelpExampleRpc("getindexinfo", "txindex")
                },
                [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue result(UniValue::VOBJ);
    const std::string index_name = request.params[0].isNull() ? "" : request.params[0].get_str();

    if (g_txindex) {
        result.pushKVs(SummaryToJSON(g_txindex->GetSummary(), index_name));
    }

    if (g_coin_stats_index) {
        result.pushKVs(SummaryToJSON(g_coin_stats_index->GetSummary(), index_name));
    }

    ForEachBlockFilterIndex([&result, &index_name](const BlockFilterIndex& index) {
        result.pushKVs(SummaryToJSON(index.GetSummary(), index_name));
    });

    return result;
},
    };
}